

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Text::Reader> expected)

{
  char *pcVar1;
  size_t sVar2;
  uint index;
  ulong uVar3;
  Reader a;
  ListElementCount local_54;
  Fault f;
  ArrayPtr<char> local_48;
  ulong local_38;
  
  local_38 = expected._M_len;
  if (reader.builder.elementCount == local_38) {
    for (index = 0; uVar3 = (ulong)index, uVar3 < local_38; index = index + 1) {
      pcVar1 = expected._M_array[uVar3].super_StringPtr.content.ptr;
      sVar2 = expected._M_array[uVar3].super_StringPtr.content.size_;
      List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]((Builder *)&f,&reader,index);
      a.super_StringPtr.content.size_ = sVar2;
      a.super_StringPtr.content.ptr = pcVar1;
      checkElement<capnp::Text::Reader>(a,(Reader)local_48);
    }
    return;
  }
  local_54 = reader.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_38,&local_54);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}